

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_oid(uchar **p,uchar *start,char *oid,size_t oid_len)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  if ((ulong)((long)puVar1 - (long)start) < oid_len || puVar1 < start) {
    oid_len = 0xffffffffffffff94;
  }
  else {
    *p = puVar1 + -oid_len;
    switchD_00916250::default(puVar1 + -oid_len,oid,oid_len);
    if (-1 < (int)(uint)oid_len) {
      iVar2 = mbedtls_asn1_write_len_and_tag(p,start,(ulong)((uint)oid_len & 0x7fffffff),'\x06');
      return iVar2;
    }
  }
  return (int)oid_len;
}

Assistant:

int mbedtls_asn1_write_oid(unsigned char **p, const unsigned char *start,
                           const char *oid, size_t oid_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) oid, oid_len));
    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_OID);
}